

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

int __thiscall
gmlc::utilities::stringOps::trailingStringInt
          (stringOps *this,string_view input,string *output,int defNum)

{
  ulong uVar1;
  ulong __n;
  string *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  int num;
  string_view input_local;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  this_00 = (string *)input._M_str;
  input_local._M_str = (char *)input._M_len;
  num = (int)output;
  input_local._M_len = (size_t)this;
  if ((this == (stringOps *)0x0) ||
     ((int)(input_local._M_str + -1)[(long)this] - 0x3aU < 0xfffffff6)) {
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              (this_00,(basic_string_view<char,_std::char_traits<char>_> *)&input_local);
  }
  else {
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&input_local,"0123456789",0xffffffffffffffff,10);
    if (__n == 0xffffffffffffffff) {
      if (input_local._M_len < 0xb) {
        *(undefined8 *)(this_00 + 8) = 0;
        **(undefined1 **)this_00 = 0;
        std::from_chars<int>(input_local._M_str,input_local._M_str + input_local._M_len,&num,10);
        return num;
      }
      __n = input_local._M_len - 10;
    }
    if (__n == input_local._M_len - 2) {
      num = input_local._M_str[input_local._M_len - 1] + -0x30;
    }
    else if ((input_local._M_len < 0xb) || (uVar1 = input_local._M_len - 10, uVar1 <= __n)) {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,__n + 1,
                         0xffffffffffffffff);
      std::from_chars<int>(bVar2._M_str,bVar2._M_str + bVar2._M_len,&num,10);
    }
    else {
      bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,
                         input_local._M_len - 9,0xffffffffffffffff);
      std::from_chars<int>(bVar2._M_str,bVar2._M_str + bVar2._M_len,&num,10);
      __n = uVar1;
    }
    if ((input_local._M_str[__n] == '_') || (input_local._M_str[__n] == '#')) {
      local_30 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,0,__n);
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                (this_00,&local_30);
    }
    else {
      local_30 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,0,
                            __n + 1);
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                (this_00,&local_30);
    }
  }
  return num;
}

Assistant:

int trailingStringInt(
        std::string_view input,
        std::string& output,
        int defNum) noexcept
    {
        if ((input.empty()) || (isdigit(input.back()) == 0)) {
            output = input;
            return defNum;
        }
        int num = defNum;
        auto pos1 = input.find_last_not_of(digits);
        if (pos1 == std::string::npos)  // in case the whole thing is a number
        {
            if (input.length() <= 10) {
                output.clear();
                std::from_chars(input.data(), input.data() + input.size(), num);
                return num;
            }
            pos1 = input.length() - 10;
        }

        size_t length = input.length();
        if (pos1 == length - 2) {
            num = input.back() - '0';
        } else if (length <= 10 || pos1 >= length - 10) {
            auto sub = input.substr(pos1 + 1);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
        } else {
            auto sub = input.substr(length - 9);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
            pos1 = length - 10;
        }

        if (input[pos1] == '_' || input[pos1] == '#') {
            output = input.substr(0, pos1);
        } else {
            output = input.substr(0, pos1 + 1);
        }

        return num;
    }